

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  ostringstream *poVar1;
  _Rb_tree_node_base *p_Var2;
  ostream *poVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar5;
  ShaderExecutor *pSVar6;
  int iVar7;
  MessageBuilder *this_01;
  _Rb_tree_node_base *p_Var8;
  IVal *pIVar9;
  IVal *value;
  TestStatus *__return_storage_ptr___00;
  FloatFormat *pFVar10;
  string *this_02;
  size_t sVar11;
  ulong uVar12;
  bool bVar13;
  IVal reference1;
  int numErrors;
  IVal in2;
  Environment env;
  void *outputArr [2];
  FloatFormat highpFmt;
  void *inputArr [4];
  FuncSet funcs;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  IVal in3;
  IVal in0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa78;
  IVal local_571;
  TestLog *local_570;
  long local_568;
  uint local_55c;
  size_t local_558;
  FloatFormat *local_550;
  TestStatus *local_548;
  string local_540;
  ulong local_520;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_518;
  pointer local_4e8;
  pointer local_4e0;
  undefined1 local_4d8 [16];
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  pointer local_4a8;
  pointer local_4a0;
  pointer local_498;
  pointer local_490;
  undefined1 local_488 [32];
  _Rb_tree_node_base *local_468;
  size_t local_460;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  local_428;
  string local_3f8;
  undefined1 local_3d8 [32];
  IVal *local_3b8;
  Precision local_3b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3a8;
  undefined4 local_3a0;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_258;
  ResultCollector local_1f8;
  Matrix<tcu::Interval,_2,_2> local_1a8 [3];
  
  this_00 = this->m_samplings;
  pFVar10 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar11 = (this->m_caseCtx).numRandoms;
  local_548 = __return_storage_ptr__;
  iVar7 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_550 = pFVar10;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_258,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar10,(FloatFormat *)(ulong)PVar4,(Precision)sVar11,(ulong)(iVar7 + 0xdeadbeef),
             in_stack_fffffffffffffa78);
  local_558 = (long)local_258.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_258.in0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_428,local_558);
  local_4b8 = (this->m_caseCtx).highpFormat.m_maxValue;
  local_4d8._0_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat;
  local_4d8._8_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat.m_fractionBits;
  local_4c8 = *(double *)&(this->m_caseCtx).highpFormat.m_hasInf;
  dStack_4c0 = *(double *)&(this->m_caseCtx).highpFormat.m_exactPrecision;
  local_55c = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_518._M_impl.super__Rb_tree_header._M_header;
  local_518._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_518._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_518._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_right =
       local_518._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_570 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_4a8 = local_258.in0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4a0 = local_258.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_498 = local_258.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_490 = local_258.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4e8 = local_428.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_4e0 = local_428.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar1 = (ostringstream *)(local_3d8 + 8);
  local_3d8._0_8_ = local_570;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  pFVar10 = local_550;
  std::operator<<((ostream *)poVar1,"Statement: ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_3d8,&this->m_stmt);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_488 + 8);
  local_488._8_4_ = _S_red;
  local_488._16_8_ = (_Base_ptr)0x0;
  local_460 = 0;
  pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_488._24_8_ = p_Var2;
  local_468 = p_Var2;
  (*pSVar5->_vptr_Statement[4])(pSVar5,local_488);
  for (p_Var8 = (_Rb_tree_node_base *)local_488._24_8_; p_Var8 != p_Var2;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    (**(code **)(**(long **)(p_Var8 + 1) + 0x30))(*(long **)(p_Var8 + 1),local_1a8);
  }
  if (local_460 != 0) {
    poVar1 = (ostringstream *)(local_3d8 + 8);
    local_3d8._0_8_ = local_570;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar1,(string *)&local_540);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_488);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  pSVar6 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pIVar9 = (IVal *)&local_4e8;
  (*pSVar6->_vptr_ShaderExecutor[2])(pSVar6,local_558,&local_4a8,pIVar9,0);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_3d8);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(local_1a8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_518,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_3d8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_518,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_488);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_518,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_518,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_3f8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_518,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_518,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_571);
  local_568 = 0;
  uVar12 = 0;
  sVar11 = local_558;
  while( true ) {
    bVar13 = sVar11 == 0;
    sVar11 = sVar11 - 1;
    iVar7 = (int)uVar12;
    if (bVar13) break;
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix(local_1a8);
    round<tcu::Matrix<float,2,2>>
              ((IVal *)local_488,(shaderexecutor *)pFVar10,
               (FloatFormat *)
               ((long)((local_258.in0.
                        super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
               local_568),(Matrix<float,_2,_2> *)pIVar9);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)local_3d8,pFVar10,(IVal *)local_488);
    pIVar9 = Environment::lookup<tcu::Matrix<float,2,2>>
                       ((Environment *)&local_518,
                        (this->m_variables).in0.
                        super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                        .m_ptr);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=(pIVar9,(Matrix<tcu::Interval,_2,_2> *)local_3d8);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_518,
               (this->m_variables).in1.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_518,
               (this->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_518,
               (this->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    local_3b0 = (this->m_caseCtx).precision;
    pIVar9 = (IVal *)pFVar10->m_maxValue;
    local_3d8._0_8_ = *(undefined8 *)pFVar10;
    local_3d8._8_4_ = pFVar10->m_fractionBits;
    local_3d8._12_4_ = pFVar10->m_hasSubnormal;
    local_3d8._16_4_ = pFVar10->m_hasInf;
    local_3d8._20_4_ = pFVar10->m_hasNaN;
    local_3d8[0x18] = pFVar10->m_exactPrecision;
    local_3d8._25_3_ = *(undefined3 *)&pFVar10->field_0x19;
    local_3d8._28_4_ = *(undefined4 *)&pFVar10->field_0x1c;
    local_3a0 = 0;
    pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_3b8 = pIVar9;
    local_3a8 = &local_518;
    (*pSVar5->_vptr_Statement[3])(pSVar5,(IVal *)local_3d8);
    value = Environment::lookup<tcu::Matrix<float,2,2>>
                      ((Environment *)&local_518,
                       (this->m_variables).out0.
                       super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                       .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)local_3d8,(FloatFormat *)local_4d8,value);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=(local_1a8,(IVal *)local_3d8);
    bVar13 = ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::
             doContains(local_1a8,
                        (Matrix<float,_2,_2> *)
                        ((long)((local_428.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                               m_data + local_568));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_3d8,"Shader output 0 is outside acceptable range",
               (allocator<char> *)local_488);
    bVar13 = tcu::ResultCollector::check(&local_1f8,bVar13,(string *)local_3d8);
    std::__cxx11::string::~string((string *)local_3d8);
    pFVar10 = local_550;
    if (!bVar13) {
      local_55c = iVar7 + 1;
      uVar12 = (ulong)local_55c;
      if ((int)local_55c < 0x65) {
        local_3d8._0_8_ = local_570;
        poVar1 = (ostringstream *)(local_3d8 + 8);
        local_520 = (ulong)local_55c;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Failed");
        std::operator<<((ostream *)poVar1," sample:\n");
        std::operator<<((ostream *)poVar1,"\t");
        std::__cxx11::string::string
                  ((string *)local_488,
                   (string *)
                   &((this->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)(local_3d8 + 8),(string *)local_488);
        std::operator<<((ostream *)(local_3d8 + 8)," = ");
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_540,(shaderexecutor *)local_4d8,
                   (FloatFormat *)
                   ((long)((local_258.in0.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   local_568),(Matrix<float,_2,_2> *)pIVar9);
        poVar3 = (ostream *)(local_3d8 + 8);
        std::operator<<(poVar3,(string *)&local_540);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_540);
        std::__cxx11::string::~string((string *)local_488);
        std::operator<<(poVar3,"\t");
        std::__cxx11::string::string
                  ((string *)local_488,
                   (string *)
                   &((this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)(local_3d8 + 8),(string *)local_488);
        std::operator<<((ostream *)(local_3d8 + 8)," = ");
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_540,(shaderexecutor *)local_4d8,
                   (FloatFormat *)
                   ((long)((local_428.out0.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   local_568),(Matrix<float,_2,_2> *)pIVar9);
        poVar3 = (ostream *)(local_3d8 + 8);
        std::operator<<(poVar3,(string *)&local_540);
        std::operator<<(poVar3,"\n");
        std::operator<<(poVar3,"\tExpected range: ");
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_3f8,(shaderexecutor *)local_4d8,(FloatFormat *)local_1a8,pIVar9);
        poVar3 = (ostream *)(local_3d8 + 8);
        std::operator<<(poVar3,(string *)&local_3f8);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_540);
        std::__cxx11::string::~string((string *)local_488);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar3);
        uVar12 = local_520;
      }
    }
    local_568 = local_568 + 0x10;
  }
  if (iVar7 < 0x65) {
    if (iVar7 == 0) {
      poVar1 = (ostringstream *)(local_3d8 + 8);
      local_3d8._0_8_ = local_570;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_3d8,"Pass",(allocator<char> *)local_1a8);
      __return_storage_ptr___00 = local_548;
      tcu::TestStatus::pass(local_548,(string *)local_3d8);
      this_02 = (string *)local_3d8;
      goto LAB_00845801;
    }
  }
  else {
    poVar1 = (ostringstream *)(local_3d8 + 8);
    local_3d8._0_8_ = local_570;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"(Skipped ");
    std::ostream::operator<<(poVar1,iVar7 + -100);
    std::operator<<((ostream *)poVar1," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  poVar1 = (ostringstream *)(local_3d8 + 8);
  local_3d8._0_8_ = local_570;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::ostream::operator<<(poVar1,iVar7);
  std::operator<<((ostream *)poVar1,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  de::toString<int>((string *)local_1a8,(int *)&local_55c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_488," test failed. Check log for the details",
             (allocator<char> *)&local_540);
  __return_storage_ptr___00 = local_548;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_3d8);
  std::__cxx11::string::~string((string *)local_3d8);
  std::__cxx11::string::~string((string *)local_488);
  this_02 = (string *)local_1a8;
LAB_00845801:
  std::__cxx11::string::~string(this_02);
  tcu::ResultCollector::~ResultCollector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_518);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  ~Outputs(&local_428);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&local_258);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}